

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

int Saig_ManVerifyCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  int i;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  uVar9 = 0;
  while (iVar7 = (int)uVar9, iVar7 < pAig->nRegs) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar7);
    *(ulong *)((long)pvVar2 + 0x18) =
         *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
         (ulong)(((uint)(&p[1].iPo)[uVar9 >> 5] >> ((byte)uVar9 & 0x1f) & 1) << 5);
    uVar9 = (ulong)(iVar7 + 1);
  }
  iVar7 = 0;
  do {
    iVar8 = (int)uVar9;
    if (p->iFrame < iVar7) {
LAB_0058cc48:
      if (iVar8 == p->nBits) {
        pAVar3 = Aig_ManCo(pAig,p->iPo);
        uVar5 = *(uint *)&pAVar3->field_0x18;
        Aig_ManCleanMarkB(pAig);
        return uVar5 >> 5 & 1;
      }
      __assert_fail("iBit == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                    ,0x12f,"int Saig_ManVerifyCex(Aig_Man_t *, Abc_Cex_t *)");
    }
    for (i = 0; uVar5 = iVar8 + i, i < pAig->nTruePis; i = i + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,i);
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&p[1].iPo)[(int)uVar5 >> 5] >> ((byte)uVar5 & 0x1f) & 1) << 5);
    }
    for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vObjs,iVar6);
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
      }
    }
    for (iVar6 = 0; iVar6 < pAig->vCos->nSize; iVar6 = iVar6 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCos,iVar6);
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 5 ^
                   *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
    }
    if (iVar7 == p->iFrame) {
      iVar8 = iVar8 + i;
      goto LAB_0058cc48;
    }
    for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
      pAVar3 = Saig_ManLi(pAig,iVar8);
      pAVar4 = Saig_ManLo(pAig,iVar8);
      *(ulong *)&pAVar4->field_0x18 =
           *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)*(undefined8 *)&pAVar3->field_0x18 & 0x20);
    }
    iVar7 = iVar7 + 1;
    uVar9 = (ulong)uVar5;
  } while( true );
}

Assistant:

int Saig_ManVerifyCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    RetValue = Aig_ManCo(pAig, p->iPo)->fMarkB;
    Aig_ManCleanMarkB(pAig);
    return RetValue;
}